

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::FinalizeRegisters
          (ByteCodeGenerator *this,FuncInfo *funcInfo,FunctionBody *byteCodeFunction)

{
  bool bVar1;
  RegSlot reg;
  FunctionBody *this_00;
  uint count;
  
  if ((*(uint *)&funcInfo->field_0xb4 >> 0xe & 1) != 0) {
    if ((*(uint *)&funcInfo->field_0xb4 & 0x20) == 0) {
      bVar1 = FuncInfo::IsGlobalFunction(funcInfo);
      if (!bVar1) goto LAB_0075d11f;
      bVar1 = (this->flags & 0x400) == 0;
    }
    else {
LAB_0075d11f:
      bVar1 = false;
    }
    FuncInfo::AssignEnvRegister(funcInfo,bVar1);
  }
  this_00 = byteCodeFunction;
  Js::FunctionBody::CheckAndSetConstantCount(byteCodeFunction,funcInfo->constRegsCount);
  SetClosureRegisters((ByteCodeGenerator *)this_00,funcInfo,byteCodeFunction);
  bVar1 = IsInDebugMode(this);
  if (!bVar1) {
    bVar1 = Js::FunctionProxy::IsCoroutine((FunctionProxy *)byteCodeFunction);
    if (!bVar1) goto LAB_0075d194;
  }
  count = funcInfo->innerScopeCount;
  Js::FunctionBody::SetInnerScopeCount(byteCodeFunction,count);
  if (count != 0) {
    reg = FuncInfo::NextVarRegister(funcInfo);
    FuncInfo::SetFirstInnerScopeReg(funcInfo,reg);
    while (count = count - 1, count != 0) {
      FuncInfo::NextVarRegister(funcInfo);
    }
  }
LAB_0075d194:
  bVar1 = Js::FunctionProxy::IsCoroutine((FunctionProxy *)byteCodeFunction);
  if (bVar1) {
    if ((funcInfo->root->fncFlags & kFunctionIsAsync) != kFunctionNone) {
      FuncInfo::AssignAwaitRegister(funcInfo);
    }
    FuncInfo::AssignYieldRegister(funcInfo);
  }
  FuncInfo::SetFirstTmpReg(funcInfo,funcInfo->varRegsCount);
  Js::FunctionBody::SetFirstTmpReg
            (byteCodeFunction,funcInfo->varRegsCount + funcInfo->constRegsCount);
  return;
}

Assistant:

void ByteCodeGenerator::FinalizeRegisters(FuncInfo* funcInfo, Js::FunctionBody* byteCodeFunction)
{
    if (funcInfo->NeedEnvRegister())
    {
        bool constReg = !funcInfo->GetIsTopLevelEventHandler() && funcInfo->IsGlobalFunction() && !(this->flags & fscrEval);
        funcInfo->AssignEnvRegister(constReg);
    }

    // Set the function body's constant count before emitting anything so that the byte code writer
    // can distinguish constants from variables.
    byteCodeFunction->CheckAndSetConstantCount(funcInfo->constRegsCount);

    this->SetClosureRegisters(funcInfo, byteCodeFunction);

    if (this->IsInDebugMode() || byteCodeFunction->IsCoroutine())
    {
        // Give permanent registers to the inner scopes in debug mode.
        // TODO: We create seperate debuggerscopes for each block which has own scope. These are stored in the var registers
        // allocated below. Ideally we should change this logic to not allocate separate registers for these and save the debug
        // info in corresponding symbols and use it from there. This will also affect the temp register allocation logic in
        // EmitOneFunction.
        uint innerScopeCount = funcInfo->InnerScopeCount();
        byteCodeFunction->SetInnerScopeCount(innerScopeCount);
        if (innerScopeCount)
        {
            funcInfo->SetFirstInnerScopeReg(funcInfo->NextVarRegister());
            for (uint i = 1; i < innerScopeCount; i++)
            {
                funcInfo->NextVarRegister();
            }
        }
    }

    // NOTE: The FunctionBody expects the yield reg to be the final non-temp.
    if (byteCodeFunction->IsCoroutine())
    {
        if (funcInfo->root->IsAsync())
        {
            funcInfo->AssignAwaitRegister();
        }
        funcInfo->AssignYieldRegister();
    }

    Js::RegSlot firstTmpReg = funcInfo->varRegsCount;
    funcInfo->SetFirstTmpReg(firstTmpReg);
    byteCodeFunction->SetFirstTmpReg(funcInfo->RegCount());
}